

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void InitEXRImage(EXRImage *exrImage)

{
  EXRImage *exrImage_local;
  
  if (exrImage != (EXRImage *)0x0) {
    exrImage->num_custom_attributes = 0;
    exrImage->num_channels = 0;
    exrImage->channel_names = (char **)0x0;
    exrImage->images = (uchar **)0x0;
    exrImage->pixel_types = (int *)0x0;
    exrImage->requested_pixel_types = (int *)0x0;
  }
  return;
}

Assistant:

void InitEXRImage(EXRImage *exrImage) {
  if (exrImage == NULL) {
    return;
  }

  exrImage->num_custom_attributes = 0;
  exrImage->num_channels = 0;
  exrImage->channel_names = NULL;
  exrImage->images = NULL;
  exrImage->pixel_types = NULL;
  exrImage->requested_pixel_types = NULL;
}